

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::specToTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TestSpec *spec)

{
  ostream *poVar1;
  undefined1 local_190 [7];
  bool firstOperation;
  ostringstream stream;
  TestSpec *spec_local;
  
  stream._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::operator<<((ostream *)local_190,"Test ");
  if ((*(uint *)(stream._368_8_ + 4) & 4) != 0) {
    std::operator<<((ostream *)local_190,"atomicCounter()");
  }
  if ((*(uint *)(stream._368_8_ + 4) & 1) != 0) {
    std::operator<<((ostream *)local_190,", ");
    std::operator<<((ostream *)local_190," atomicCounterIncrement()");
  }
  if ((*(uint *)(stream._368_8_ + 4) & 2) != 0) {
    std::operator<<((ostream *)local_190,", ");
    std::operator<<((ostream *)local_190," atomicCounterDecrement()");
  }
  std::operator<<((ostream *)local_190," calls with ");
  if ((*(byte *)(stream._368_8_ + 0xc) & 1) != 0) {
    std::operator<<((ostream *)local_190," branches, ");
  }
  poVar1 = (ostream *)std::ostream::operator<<(local_190,*(int *)stream._368_8_);
  poVar1 = std::operator<<(poVar1," atomic counters, ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(stream._368_8_ + 8));
  poVar1 = std::operator<<(poVar1," calls and ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(stream._368_8_ + 0x10));
  std::operator<<(poVar1," threads.");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

string specToTestDescription (const AtomicCounterTest::TestSpec& spec)
{
	std::ostringstream	stream;
	bool				firstOperation = 0;

	stream
	<< "Test ";

	if ((spec.operations & AtomicCounterTest::OPERATION_GET) != 0)
	{
		stream << "atomicCounter()";
		firstOperation = false;
	}

	if ((spec.operations & AtomicCounterTest::OPERATION_INC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterIncrement()";
		firstOperation = false;
	}

	if ((spec.operations & AtomicCounterTest::OPERATION_DEC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterDecrement()";
		firstOperation = false;
	}

	stream << " calls with ";

	if (spec.useBranches)
		stream << " branches, ";

	stream << spec.atomicCounterCount << " atomic counters, " << spec.callCount << " calls and " << spec.threadCount << " threads.";

	return stream.str();
}